

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

FileSystem * __thiscall efsw::FileSystem::fileNameFromPath(FileSystem *this,string *filepath)

{
  char cVar1;
  long lVar2;
  size_t pos;
  string *filepath_local;
  
  dirRemoveSlashAtEnd(filepath);
  cVar1 = getOSSlash();
  lVar2 = std::__cxx11::string::find_last_of((char)filepath,(ulong)(uint)(int)cVar1);
  if (lVar2 == -1) {
    std::__cxx11::string::string((string *)this,(string *)filepath);
  }
  else {
    std::__cxx11::string::substr((ulong)this,(ulong)filepath);
  }
  return this;
}

Assistant:

std::string FileSystem::fileNameFromPath( std::string filepath ) {
	dirRemoveSlashAtEnd( filepath );

	size_t pos = filepath.find_last_of( getOSSlash() );

	if ( pos != std::string::npos ) {
		return filepath.substr( pos + 1 );
	}

	return filepath;
}